

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btConvexTriangleCallback::setTimeStepAndCounters
          (btConvexTriangleCallback *this,btScalar collisionMarginTriangle,
          btDispatcherInfo *dispatchInfo,btCollisionObjectWrapper *convexBodyWrap,
          btCollisionObjectWrapper *triBodyWrap,btManifoldResult *resultOut)

{
  btCollisionShape *pbVar1;
  btVector3 extra;
  btTransform convexInTriangleSpace;
  btTransform local_d8;
  btScalar local_98;
  btScalar bStack_94;
  btScalar bStack_90;
  btScalar bStack_8c;
  btScalar local_88;
  btScalar bStack_84;
  btScalar bStack_80;
  btScalar bStack_7c;
  btScalar local_78;
  btScalar bStack_74;
  btScalar bStack_70;
  btScalar bStack_6c;
  btScalar local_68;
  btScalar bStack_64;
  btScalar bStack_60;
  btScalar bStack_5c;
  btTransform local_58;
  
  this->m_convexBodyWrap = convexBodyWrap;
  this->m_triBodyWrap = triBodyWrap;
  this->m_dispatchInfoPtr = dispatchInfo;
  this->m_collisionMarginTriangle = collisionMarginTriangle;
  this->m_resultOut = resultOut;
  btTransform::inverse(&local_58,triBodyWrap->m_worldTransform);
  btTransform::operator*(&local_d8,&local_58,this->m_convexBodyWrap->m_worldTransform);
  local_98 = local_d8.m_basis.m_el[0].m_floats[0];
  bStack_94 = local_d8.m_basis.m_el[0].m_floats[1];
  bStack_90 = local_d8.m_basis.m_el[0].m_floats[2];
  bStack_8c = local_d8.m_basis.m_el[0].m_floats[3];
  local_88 = local_d8.m_basis.m_el[1].m_floats[0];
  bStack_84 = local_d8.m_basis.m_el[1].m_floats[1];
  bStack_80 = local_d8.m_basis.m_el[1].m_floats[2];
  bStack_7c = local_d8.m_basis.m_el[1].m_floats[3];
  local_78 = local_d8.m_basis.m_el[2].m_floats[0];
  bStack_74 = local_d8.m_basis.m_el[2].m_floats[1];
  bStack_70 = local_d8.m_basis.m_el[2].m_floats[2];
  bStack_6c = local_d8.m_basis.m_el[2].m_floats[3];
  local_68 = local_d8.m_origin.m_floats[0];
  bStack_64 = local_d8.m_origin.m_floats[1];
  bStack_60 = local_d8.m_origin.m_floats[2];
  bStack_5c = local_d8.m_origin.m_floats[3];
  pbVar1 = this->m_convexBodyWrap->m_shape;
  (*pbVar1->_vptr_btCollisionShape[2])(pbVar1,&local_98,&this->m_aabbMin,&this->m_aabbMax);
  local_d8.m_basis.m_el[0].m_floats[3] = 0.0;
  local_d8.m_basis.m_el[0].m_floats[0] = collisionMarginTriangle;
  local_d8.m_basis.m_el[0].m_floats[1] = collisionMarginTriangle;
  local_d8.m_basis.m_el[0].m_floats[2] = collisionMarginTriangle;
  btVector3::operator+=(&this->m_aabbMax,(btVector3 *)&local_d8);
  btVector3::operator-=(&this->m_aabbMin,(btVector3 *)&local_d8);
  return;
}

Assistant:

void	btConvexTriangleCallback::setTimeStepAndCounters(btScalar collisionMarginTriangle,const btDispatcherInfo& dispatchInfo,const btCollisionObjectWrapper* convexBodyWrap, const btCollisionObjectWrapper* triBodyWrap, btManifoldResult* resultOut)
{
	m_convexBodyWrap = convexBodyWrap;
	m_triBodyWrap = triBodyWrap;

	m_dispatchInfoPtr = &dispatchInfo;
	m_collisionMarginTriangle = collisionMarginTriangle;
	m_resultOut = resultOut;

	//recalc aabbs
	btTransform convexInTriangleSpace;
	convexInTriangleSpace = m_triBodyWrap->getWorldTransform().inverse() * m_convexBodyWrap->getWorldTransform();
	const btCollisionShape* convexShape = static_cast<const btCollisionShape*>(m_convexBodyWrap->getCollisionShape());
	//CollisionShape* triangleShape = static_cast<btCollisionShape*>(triBody->m_collisionShape);
	convexShape->getAabb(convexInTriangleSpace,m_aabbMin,m_aabbMax);
	btScalar extraMargin = collisionMarginTriangle;
	btVector3 extra(extraMargin,extraMargin,extraMargin);

	m_aabbMax += extra;
	m_aabbMin -= extra;
	
}